

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O2

Status __thiscall leveldb::anon_unknown_1::PosixEnv::UnlockFile(PosixEnv *this,FileLock *lock)

{
  int iVar1;
  int *piVar2;
  long *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  iVar1 = LockOrUnlock((int)in_RDX[1],false);
  if (iVar1 == -1) {
    std::operator+(&bStack_38,"unlock ",(string *)(in_RDX + 2));
    piVar2 = __errno_location();
    PosixError((anon_unknown_1 *)this,&bStack_38,*piVar2);
    std::__cxx11::string::_M_dispose();
  }
  else {
    PosixLockTable::Remove((PosixLockTable *)(lock + 0x18),(string *)(in_RDX + 2));
    close((int)in_RDX[1]);
    (**(code **)(*in_RDX + 8))();
    (this->super_Env)._vptr_Env = (_func_int **)0x0;
  }
  return (Status)(char *)this;
}

Assistant:

Status UnlockFile(FileLock* lock) override {
    PosixFileLock* posix_file_lock = static_cast<PosixFileLock*>(lock);
    if (LockOrUnlock(posix_file_lock->fd(), false) == -1) {
      return PosixError("unlock " + posix_file_lock->filename(), errno);
    }
    locks_.Remove(posix_file_lock->filename());
    ::close(posix_file_lock->fd());
    delete posix_file_lock;
    return Status::OK();
  }